

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::FMixFeedingExtract::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Op OVar1;
  uint32_t uVar2;
  int iVar3;
  DefUseManager *this_00;
  ConstantManager *this_01;
  Instruction *this_02;
  FeatureManager *this_03;
  Instruction *__p;
  pointer pIVar4;
  InstructionFolder *this_04;
  Type *pTVar5;
  undefined4 extraout_var;
  uint32_t local_fc;
  iterator local_f8;
  undefined8 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  uint32_t local_bc;
  double dStack_b8;
  uint32_t new_vector;
  double element_value;
  Constant *pCStack_a8;
  bool use_x;
  Constant *a_const;
  iterator local_98;
  undefined8 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_60;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> a;
  uint32_t a_id;
  uint32_t inst_set_id;
  Instruction *composite_inst;
  uint32_t composite_id;
  ConstantManager *const_mgr;
  DefUseManager *def_use_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_3_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 != OpCompositeExtract) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract && \"Wrong opcode.  Should be OpCompositeExtract.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x7a2,
                  "auto spvtools::opt::(anonymous namespace)::FMixFeedingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(context);
  this_01 = IRContext::get_constant_mgr(context);
  uVar2 = Instruction::GetSingleWordInOperand(inst,0);
  this_02 = analysis::DefUseManager::GetDef(this_00,uVar2);
  OVar1 = Instruction::opcode(this_02);
  if (OVar1 != OpExtInst) {
    return false;
  }
  this_03 = IRContext::get_feature_mgr(context);
  a._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       FeatureManager::GetExtInstImportId_GLSLstd450(this_03);
  uVar2 = Instruction::GetSingleWordInOperand(this_02,0);
  if ((uVar2 != a._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_) ||
     (uVar2 = Instruction::GetSingleWordInOperand(this_02,1), uVar2 != 0x2e)) {
    return false;
  }
  a._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       Instruction::GetSingleWordInOperand(this_02,4);
  __p = Instruction::Clone(inst,context);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_60,__p);
  pIVar4 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_60);
  a_const._4_4_ =
       (uint32_t)
       a._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_98 = (iterator)((long)&a_const + 4);
  local_90 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_98;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,init_list_00);
  Instruction::SetInOperand(pIVar4,0,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88);
  this_04 = IRContext::get_instruction_folder(context);
  pIVar4 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(&local_60);
  InstructionFolder::FoldInstruction(this_04,pIVar4);
  pIVar4 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_60);
  OVar1 = Instruction::opcode(pIVar4);
  if (OVar1 == OpCopyObject) {
    pIVar4 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&local_60);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar4,0);
    pCStack_a8 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar2);
    if (pCStack_a8 == (Constant *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      element_value._7_1_ = '\0';
      pTVar5 = analysis::Constant::type(pCStack_a8);
      iVar3 = (*pTVar5->_vptr_Type[0xc])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        __assert_fail("a_const->type()->AsFloat()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x7cb,
                      "auto spvtools::opt::(anonymous namespace)::FMixFeedingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                     );
      }
      dStack_b8 = analysis::Constant::GetValueAsDouble(pCStack_a8);
      if ((dStack_b8 != 0.0) || (NAN(dStack_b8))) {
        if ((dStack_b8 != 1.0) || (NAN(dStack_b8))) {
          this_local._7_1_ = false;
          goto LAB_0037ad17;
        }
        element_value._7_1_ = '\0';
      }
      else {
        element_value._7_1_ = '\x01';
      }
      local_bc = 0;
      if (element_value._7_1_ == '\0') {
        local_bc = Instruction::GetSingleWordInOperand(this_02,3);
      }
      else {
        local_bc = Instruction::GetSingleWordInOperand(this_02,2);
      }
      local_fc = local_bc;
      local_f8 = &local_fc;
      local_f0 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_f8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,init_list);
      Instruction::SetInOperand(inst,0,&local_e8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e8);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0037ad17:
  a_const._0_4_ = 1;
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_60);
  return this_local._7_1_;
}

Assistant:

FoldingRule FMixFeedingExtract() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>&) {
    assert(inst->opcode() == spv::Op::OpCompositeExtract &&
           "Wrong opcode.  Should be OpCompositeExtract.");
    analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();

    uint32_t composite_id =
        inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
    Instruction* composite_inst = def_use_mgr->GetDef(composite_id);

    if (composite_inst->opcode() != spv::Op::OpExtInst) {
      return false;
    }

    uint32_t inst_set_id =
        context->get_feature_mgr()->GetExtInstImportId_GLSLstd450();

    if (composite_inst->GetSingleWordInOperand(kExtInstSetIdInIdx) !=
            inst_set_id ||
        composite_inst->GetSingleWordInOperand(kExtInstInstructionInIdx) !=
            GLSLstd450FMix) {
      return false;
    }

    // Get the |a| for the FMix instruction.
    uint32_t a_id = composite_inst->GetSingleWordInOperand(kFMixAIdInIdx);
    std::unique_ptr<Instruction> a(inst->Clone(context));
    a->SetInOperand(kExtractCompositeIdInIdx, {a_id});
    context->get_instruction_folder().FoldInstruction(a.get());

    if (a->opcode() != spv::Op::OpCopyObject) {
      return false;
    }

    const analysis::Constant* a_const =
        const_mgr->FindDeclaredConstant(a->GetSingleWordInOperand(0));

    if (!a_const) {
      return false;
    }

    bool use_x = false;

    assert(a_const->type()->AsFloat());
    double element_value = a_const->GetValueAsDouble();
    if (element_value == 0.0) {
      use_x = true;
    } else if (element_value == 1.0) {
      use_x = false;
    } else {
      return false;
    }

    // Get the id of the of the vector the element comes from.
    uint32_t new_vector = 0;
    if (use_x) {
      new_vector = composite_inst->GetSingleWordInOperand(kFMixXIdInIdx);
    } else {
      new_vector = composite_inst->GetSingleWordInOperand(kFMixYIdInIdx);
    }

    // Update the extract instruction.
    inst->SetInOperand(kExtractCompositeIdInIdx, {new_vector});
    return true;
  };
}